

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::doLayout(QColumnViewPrivate *this)

{
  QWidgetData *pQVar1;
  QWidget *pQVar2;
  int iVar3;
  LayoutDirection LVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) &&
     ((this->columns).d.size != 0)) {
    pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar7 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    pQVar2 = *(QWidget **)
              &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    iVar3 = QWidget::x((QWidget *)*(this->columns).d.ptr);
    LVar4 = QWidget::layoutDirection(pQVar2);
    if (LVar4 == RightToLeft) {
      pQVar1 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
               data;
      iVar3 = (pQVar1->crect).x1.m_i;
      iVar6 = (pQVar1->crect).x2.m_i;
      iVar5 = (**(code **)(*(long *)pQVar2 + 0x2b0))(pQVar2);
      if ((this->columns).d.size != 0) {
        iVar3 = (iVar6 - iVar3) + iVar5 + 1;
        uVar8 = 0;
        do {
          pQVar2 = (QWidget *)(this->columns).d.ptr[uVar8];
          iVar3 = iVar3 + ~(pQVar2->data->crect).x2.m_i + (pQVar2->data->crect).x1.m_i;
          iVar6 = QWidget::x(pQVar2);
          if ((iVar3 != iVar6) ||
             (iVar7 + 1 != ((pQVar2->data->crect).y2.m_i - (pQVar2->data->crect).y1.m_i) + 1)) {
            local_48.x2.m_i = ((pQVar2->data->crect).x2.m_i + iVar3) - (pQVar2->data->crect).x1.m_i;
            local_48.y1.m_i = 0;
            local_48.x1.m_i = iVar3;
            local_48.y2.m_i = iVar7;
            QWidget::setGeometry(pQVar2,&local_48);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(this->columns).d.size);
      }
    }
    else if ((this->columns).d.size != 0) {
      uVar8 = 0;
      do {
        pQVar2 = (QWidget *)(this->columns).d.ptr[uVar8];
        iVar5 = ((pQVar2->data->crect).x2.m_i - (pQVar2->data->crect).x1.m_i) + 1;
        iVar6 = QWidget::x(pQVar2);
        if ((iVar3 != iVar6) ||
           (iVar7 + 1 != ((pQVar2->data->crect).y2.m_i - (pQVar2->data->crect).y1.m_i) + 1)) {
          local_48.y1.m_i = 0;
          local_48.x2.m_i = iVar3 + iVar5 + -1;
          local_48.x1.m_i = iVar3;
          local_48.y2.m_i = iVar7;
          QWidget::setGeometry(pQVar2,&local_48);
        }
        iVar3 = iVar3 + iVar5;
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)(this->columns).d.size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColumnViewPrivate::doLayout()
{
    Q_Q(QColumnView);
    if (!model || columns.isEmpty())
        return;

    int viewportHeight = viewport->height();
    int x = columns.at(0)->x();

    if (q->isRightToLeft()) {
        x = viewport->width() + q->horizontalOffset();
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            x -= view->width();
            if (x != view->x() || viewportHeight != view->height())
                view->setGeometry(x, 0, view->width(), viewportHeight);
        }
    } else {
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            int currentColumnWidth = view->width();
            if (x != view->x() || viewportHeight != view->height())
                view->setGeometry(x, 0, currentColumnWidth, viewportHeight);
            x += currentColumnWidth;
        }
    }
}